

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O1

void Abc_MfsConvertHopToAig(Abc_Obj_t *pObjOld,Aig_Man_t *pMan)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  ulong uVar6;
  Hop_Obj_t *pObj;
  
  pObj = (Hop_Obj_t *)((ulong)(pObjOld->field_5).pData & 0xfffffffffffffffe);
  uVar4 = (pObjOld->field_5).iData;
  if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
    pAVar5 = (Abc_Obj_t *)((ulong)(uVar4 & 1) ^ (ulong)pMan->pConst1);
    (pObjOld->field_6).pTemp = pAVar5;
    pObjOld->pNext = pAVar5;
    return;
  }
  plVar1 = (long *)pObjOld->pNtk->pManFunc;
  if (0 < (pObjOld->vFanins).nSize) {
    lVar3 = 0;
    do {
      lVar2 = *plVar1;
      if (*(int *)(lVar2 + 4) <= lVar3) goto LAB_0044a0f9;
      **(undefined8 **)(*(long *)(lVar2 + 8) + lVar3 * 8) =
           *(undefined8 *)
            ((long)pObjOld->pNtk->vObjs->pArray[(pObjOld->vFanins).pArray[lVar3]] + 0x40);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pObjOld->vFanins).nSize);
  }
  Abc_MfsConvertHopToAig_rec(pObj,pMan);
  uVar6 = (ulong)(uVar4 & 1);
  (pObjOld->field_6).pTemp = (void *)((ulong)(pObj->field_0).pData ^ uVar6);
  Hop_ConeUnmark_rec(pObj);
  if (0 < (pObjOld->vFanins).nSize) {
    lVar3 = 0;
    do {
      lVar2 = *plVar1;
      if (*(int *)(lVar2 + 4) <= lVar3) {
LAB_0044a0f9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      **(undefined8 **)(*(long *)(lVar2 + 8) + lVar3 * 8) =
           *(undefined8 *)((long)pObjOld->pNtk->vObjs->pArray[(pObjOld->vFanins).pArray[lVar3]] + 8)
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pObjOld->vFanins).nSize);
  }
  Abc_MfsConvertHopToAig_rec(pObj,pMan);
  pObjOld->pNext = (Abc_Obj_t *)(uVar6 ^ (ulong)(pObj->field_0).pData);
  Hop_ConeUnmark_rec(pObj);
  return;
}

Assistant:

void Abc_MfsConvertHopToAig( Abc_Obj_t * pObjOld, Aig_Man_t * pMan )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    // get the local AIG
    pHopMan = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pObjOld->pData;
    // check the case of a constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
    {
        pObjOld->pCopy = (Abc_Obj_t *)Aig_NotCond( Aig_ManConst1(pMan), Hop_IsComplement(pRoot) );
        pObjOld->pNext = pObjOld->pCopy;
        return;
    }

    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
        Hop_ManPi(pHopMan, i)->pData = pFanin->pCopy;
    // construct the AIG
    Abc_MfsConvertHopToAig_rec( Hop_Regular(pRoot), pMan );
    pObjOld->pCopy = (Abc_Obj_t *)Aig_NotCond( (Aig_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );

    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
        Hop_ManPi(pHopMan, i)->pData = pFanin->pNext;
    // construct the AIG
    Abc_MfsConvertHopToAig_rec( Hop_Regular(pRoot), pMan );
    pObjOld->pNext = (Abc_Obj_t *)Aig_NotCond( (Aig_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
}